

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void touch_file(char *name)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  uv_loop_t *puVar4;
  uv_loop_t *loop;
  uv_buf_t *bufs;
  int extraout_EDX;
  ulong unaff_RBX;
  long lVar5;
  char *pcVar6;
  uv_handle_t *puVar7;
  uv_fs_event_t *puVar8;
  uv_fs_t *unaff_R14;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  uv_fs_t req;
  undefined1 auStackY_a00 [16];
  uv__queue uStackY_9f0;
  uv__queue *puStackY_9e0;
  uv_timer_t uStackY_9d8;
  uv_fs_event_t uStackY_960;
  uv_loop_t *puStackY_8f8;
  uv_fs_event_t *puStackY_8f0;
  long lStackY_8e8;
  long lStackY_8e0;
  uv_loop_t *puStackY_8d8;
  long lStackY_8d0;
  long lStackY_8c8;
  uv_loop_t *puStackY_8c0;
  size_t sStackY_8b0;
  size_t sStackY_8a8;
  size_t sStackY_8a0;
  char acStackY_898 [1032];
  uv_loop_t *puStackY_490;
  undefined1 auStackY_440 [16];
  uv_fs_event_t uStackY_430;
  uv_fs_event_t uStackY_3c8;
  uv_loop_t *puStackY_360;
  code *pcStackY_358;
  undefined8 uStackY_348;
  code *pcStackY_340;
  void *pvStackY_338;
  undefined1 auStackY_330 [16];
  uv_close_cb p_StackY_320;
  uv_close_cb p_StackY_318;
  uv_loop_t *puStackY_310;
  uv_handle_t *puStackY_308;
  uv_handle_t *puStackY_300;
  uv_handle_t *puStackY_2f8;
  undefined8 uStackY_2e8;
  long lStackY_2e0;
  uv_loop_t *puStackY_2d8;
  code *pcStackY_2d0;
  void *pvStackY_2c0;
  undefined1 auStackY_2b8 [128];
  uv_loop_t *puStackY_238;
  long lStackY_228;
  long lStackY_220;
  ulong uStackY_218;
  uv_fs_t *puStackY_210;
  uv_buf_t local_1e8;
  uv_fs_t local_1d8;
  
  local_1e8.len = (size_t)local_1e8.base;
  iVar3 = 2;
  puStackY_210 = (uv_fs_t *)0x1853a6;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&local_1d8,name,2,0,(uv_fs_cb)0x0);
  local_1e8.base = (char *)(long)iVar2;
  if ((char *)(long)iVar2 == (char *)0x0) {
    unaff_R14 = &local_1d8;
    unaff_RBX = (ulong)(uint)local_1d8.result;
    puStackY_210 = (uv_fs_t *)0x1853d7;
    uv_fs_req_cleanup(unaff_R14);
    puStackY_210 = (uv_fs_t *)0x1853e8;
    local_1e8 = uv_buf_init("foo",4);
    bufs = &local_1e8;
    puStackY_210 = (uv_fs_t *)0x185414;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,unaff_R14,(uint)local_1d8.result,bufs,1,-1,(uv_fs_cb)0x0);
    iVar3 = (int)bufs;
    if (iVar2 < 0) goto LAB_00185489;
    unaff_R14 = &local_1d8;
    puStackY_210 = (uv_fs_t *)0x185439;
    uv_fs_req_cleanup(unaff_R14);
    iVar3 = 0;
    puStackY_210 = (uv_fs_t *)0x185447;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,unaff_R14,(uint)local_1d8.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      puStackY_210 = (uv_fs_t *)0x18546d;
      uv_fs_req_cleanup(&local_1d8);
      return;
    }
  }
  else {
    puStackY_210 = (uv_fs_t *)0x185489;
    touch_file_cold_1();
LAB_00185489:
    puStackY_210 = (uv_fs_t *)0x185498;
    touch_file_cold_3();
  }
  puStackY_210 = (uv_fs_t *)run_test_fs_event_no_callback_on_close;
  touch_file_cold_2();
  puStackY_238 = (uv_loop_t *)0x1854b3;
  uStackY_218 = unaff_RBX;
  puStackY_210 = unaff_R14;
  puVar4 = uv_default_loop();
  puStackY_238 = (uv_loop_t *)0x1854c5;
  remove("watch_dir/file1");
  puStackY_238 = (uv_loop_t *)0x1854d1;
  remove("watch_dir/");
  puStackY_238 = (uv_loop_t *)0x1854dd;
  create_dir("watch_dir");
  puStackY_238 = (uv_loop_t *)0x1854e5;
  create_file("watch_dir/file1");
  puStackY_238 = (uv_loop_t *)0x1854f4;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  lStackY_220 = (long)iVar2;
  lStackY_228 = 0;
  if (lStackY_220 == 0) {
    iVar3 = 0;
    puStackY_238 = (uv_loop_t *)0x185530;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1",0);
    lStackY_220 = (long)iVar2;
    lStackY_228 = 0;
    if (lStackY_220 != 0) goto LAB_0018562c;
    puStackY_238 = (uv_loop_t *)0x185563;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStackY_238 = (uv_loop_t *)0x18556d;
    uv_run(puVar4,UV_RUN_DEFAULT);
    lStackY_220 = (long)fs_event_cb_called;
    lStackY_228 = 0;
    if (lStackY_220 != 0) goto LAB_0018563b;
    lStackY_220 = 1;
    lStackY_228 = (long)close_cb_called;
    if (lStackY_228 != 1) goto LAB_0018564a;
    puStackY_238 = (uv_loop_t *)0x1855c3;
    remove("watch_dir/file1");
    puStackY_238 = (uv_loop_t *)0x1855cf;
    remove("watch_dir/");
    puStackY_238 = (uv_loop_t *)0x1855e0;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStackY_238 = (uv_loop_t *)0x1855ea;
    uv_run(puVar4,UV_RUN_DEFAULT);
    lStackY_220 = 0;
    puStackY_238 = (uv_loop_t *)0x1855fb;
    iVar2 = uv_loop_close(puVar4);
    lStackY_228 = (long)iVar2;
    if (lStackY_220 == lStackY_228) {
      puStackY_238 = (uv_loop_t *)0x185613;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStackY_238 = (uv_loop_t *)0x18562c;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_0018562c:
    puStackY_238 = (uv_loop_t *)0x18563b;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_0018563b:
    puStackY_238 = (uv_loop_t *)0x18564a;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_0018564a:
    puStackY_238 = (uv_loop_t *)0x185659;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  puStackY_238 = (uv_loop_t *)run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStackY_2d0 = (code *)0x185675;
  puStackY_238 = puVar4;
  puVar4 = uv_default_loop();
  pcStackY_2d0 = (code *)0x185685;
  iVar2 = uv_timer_init(puVar4,(uv_timer_t *)(auStackY_2b8 + 8));
  auStackY_2b8._0_8_ = SEXT48(iVar2);
  pvStackY_2c0 = (void *)0x0;
  if ((void *)auStackY_2b8._0_8_ == (void *)0x0) {
    iVar3 = 0;
    pcStackY_2d0 = (code *)0x1856bd;
    iVar2 = uv_timer_start((uv_timer_t *)(auStackY_2b8 + 8),timer_cb,1,0);
    auStackY_2b8._0_8_ = SEXT48(iVar2);
    pvStackY_2c0 = (void *)0x0;
    if ((void *)auStackY_2b8._0_8_ != (void *)0x0) goto LAB_00185766;
    pcStackY_2d0 = (code *)0x1856e7;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_2b8._0_8_ = (void *)0x2;
    pvStackY_2c0 = (void *)(long)close_cb_called;
    if (pvStackY_2c0 != (void *)0x2) goto LAB_00185775;
    pcStackY_2d0 = (code *)0x185719;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStackY_2d0 = (code *)0x185723;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_2b8._0_8_ = (void *)0x0;
    pcStackY_2d0 = (code *)0x185734;
    iVar2 = uv_loop_close(puVar4);
    pvStackY_2c0 = (void *)(long)iVar2;
    if ((void *)auStackY_2b8._0_8_ == pvStackY_2c0) {
      pcStackY_2d0 = (code *)0x18574c;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStackY_2d0 = (code *)0x185766;
    run_test_fs_event_immediate_close_cold_1();
LAB_00185766:
    pcStackY_2d0 = (code *)0x185775;
    run_test_fs_event_immediate_close_cold_2();
LAB_00185775:
    pcStackY_2d0 = (code *)0x185784;
    run_test_fs_event_immediate_close_cold_3();
  }
  puVar7 = (uv_handle_t *)auStackY_2b8;
  pcStackY_2d0 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStackY_2d0 = (code *)0x1f9b0e;
  puStackY_2f8 = (uv_handle_t *)0x1857ad;
  puStackY_2d8 = puVar4;
  iVar2 = uv_fs_event_init(puVar7->loop,&fs_event);
  lStackY_2e0 = (long)iVar2;
  uStackY_2e8 = 0;
  if (lStackY_2e0 == 0) {
    iVar3 = 0;
    puStackY_2f8 = (uv_handle_t *)0x1857e5;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".",0);
    lStackY_2e0 = (long)iVar2;
    uStackY_2e8 = 0;
    if (lStackY_2e0 == 0) {
      puStackY_2f8 = (uv_handle_t *)0x185817;
      uv_close((uv_handle_t *)&fs_event,close_cb);
      uv_close(puVar7,close_cb);
      return;
    }
  }
  else {
    puStackY_2f8 = (uv_handle_t *)0x185838;
    timer_cb_cold_1();
  }
  puStackY_2f8 = (uv_handle_t *)run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  puStackY_310 = (uv_loop_t *)0x185851;
  puStackY_2f8 = puVar7;
  puVar4 = uv_default_loop();
  puStackY_310 = (uv_loop_t *)0x185860;
  create_dir("watch_dir");
  puStackY_310 = (uv_loop_t *)0x18586c;
  create_file("watch_dir/file");
  puStackY_310 = (uv_loop_t *)0x18587b;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  puStackY_300 = (uv_handle_t *)(long)iVar2;
  puStackY_308 = (uv_handle_t *)0x0;
  if (puStackY_300 == (uv_handle_t *)0x0) {
    iVar3 = 0;
    puStackY_310 = (uv_loop_t *)0x1858b5;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir",0);
    puStackY_300 = (uv_handle_t *)(long)iVar2;
    puStackY_308 = (uv_handle_t *)0x0;
    if (puStackY_300 != (uv_handle_t *)0x0) goto LAB_0018598a;
    puStackY_310 = (uv_loop_t *)0x1858df;
    touch_file("watch_dir/file");
    puStackY_310 = (uv_loop_t *)0x1858f2;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStackY_310 = (uv_loop_t *)0x1858fc;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStackY_300 = (uv_handle_t *)0x1;
    puStackY_308 = (uv_handle_t *)(long)close_cb_called;
    if (puStackY_308 != (uv_handle_t *)0x1) goto LAB_00185997;
    puStackY_310 = (uv_loop_t *)0x185927;
    remove("watch_dir/file");
    puStackY_310 = (uv_loop_t *)0x185933;
    remove("watch_dir/");
    puStackY_310 = (uv_loop_t *)0x185944;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStackY_310 = (uv_loop_t *)0x18594e;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStackY_300 = (uv_handle_t *)0x0;
    puStackY_310 = (uv_loop_t *)0x18595f;
    iVar2 = uv_loop_close(puVar4);
    puStackY_308 = (uv_handle_t *)(long)iVar2;
    if (puStackY_300 == puStackY_308) {
      puStackY_310 = (uv_loop_t *)0x185975;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStackY_310 = (uv_loop_t *)0x18598a;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_0018598a:
    puStackY_310 = (uv_loop_t *)0x185997;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_00185997:
    puStackY_310 = (uv_loop_t *)0x1859a4;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  puStackY_310 = (uv_loop_t *)run_test_fs_event_close_with_pending_delete_event;
  run_test_fs_event_close_with_pending_event_cold_4();
  auStackY_330._8_8_ = (uv_loop_t *)0x1859bb;
  puStackY_310 = puVar4;
  puVar4 = uv_default_loop();
  auStackY_330._8_8_ = (uv_loop_t *)0x1859ca;
  create_dir("watch_dir");
  auStackY_330._8_8_ = (uv_loop_t *)0x1859d6;
  create_file("watch_dir/file");
  auStackY_330._8_8_ = (uv_loop_t *)0x1859e5;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  p_StackY_318 = (uv_close_cb)(long)iVar2;
  p_StackY_320 = (uv_close_cb)0x0;
  if (p_StackY_318 == (uv_close_cb)0x0) {
    iVar3 = 0;
    auStackY_330._8_8_ = (uv_loop_t *)0x185a1f;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir/file",0);
    p_StackY_318 = (uv_close_cb)(long)iVar2;
    p_StackY_320 = (uv_close_cb)0x0;
    if (p_StackY_318 != (uv_close_cb)0x0) goto LAB_00185afa;
    auStackY_330._8_8_ = (uv_loop_t *)0x185a49;
    remove("watch_dir/file");
    auStackY_330._8_8_ = (uv_loop_t *)0x185a53;
    uv_sleep(0x44c);
    auStackY_330._8_8_ = (uv_loop_t *)0x185a5b;
    uv_update_time(puVar4);
    auStackY_330._8_8_ = (uv_loop_t *)0x185a6e;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    auStackY_330._8_8_ = (uv_loop_t *)0x185a78;
    uv_run(puVar4,UV_RUN_DEFAULT);
    p_StackY_318 = (uv_close_cb)0x1;
    p_StackY_320 = (uv_close_cb)(long)close_cb_called;
    if (p_StackY_320 != (uv_close_cb)0x1) goto LAB_00185b07;
    auStackY_330._8_8_ = (uv_loop_t *)0x185aa3;
    remove("watch_dir/");
    auStackY_330._8_8_ = (uv_loop_t *)0x185ab4;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    auStackY_330._8_8_ = (uv_loop_t *)0x185abe;
    uv_run(puVar4,UV_RUN_DEFAULT);
    p_StackY_318 = (uv_close_cb)0x0;
    auStackY_330._8_8_ = (uv_loop_t *)0x185acf;
    iVar2 = uv_loop_close(puVar4);
    p_StackY_320 = (uv_close_cb)(long)iVar2;
    if (p_StackY_318 == p_StackY_320) {
      auStackY_330._8_8_ = (uv_loop_t *)0x185ae5;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStackY_330._8_8_ = (uv_loop_t *)0x185afa;
    run_test_fs_event_close_with_pending_delete_event_cold_1();
LAB_00185afa:
    auStackY_330._8_8_ = (uv_loop_t *)0x185b07;
    run_test_fs_event_close_with_pending_delete_event_cold_2();
LAB_00185b07:
    auStackY_330._8_8_ = (uv_loop_t *)0x185b14;
    run_test_fs_event_close_with_pending_delete_event_cold_3();
  }
  auStackY_330._8_8_ = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_delete_event_cold_4();
  pcStackY_340 = (code *)0x185b2b;
  auStackY_330._8_8_ = puVar4;
  puVar4 = uv_default_loop();
  pcStackY_340 = (code *)0x185b35;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStackY_340 = (code *)0x185b41;
  create_dir("watch_dir");
  pcStackY_340 = (code *)0x185b50;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  auStackY_330._0_8_ = SEXT48(iVar2);
  pvStackY_338 = (void *)0x0;
  if ((void *)auStackY_330._0_8_ == (void *)0x0) {
    iVar3 = 0;
    pcStackY_340 = (code *)0x185b8a;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir",0);
    auStackY_330._0_8_ = SEXT48(iVar2);
    pvStackY_338 = (void *)0x0;
    if ((void *)auStackY_330._0_8_ != (void *)0x0) goto LAB_00185ce7;
    pcStackY_340 = (code *)0x185bb7;
    iVar2 = uv_timer_init(puVar4,&timer);
    auStackY_330._0_8_ = SEXT48(iVar2);
    pvStackY_338 = (void *)0x0;
    if ((void *)auStackY_330._0_8_ != (void *)0x0) goto LAB_00185cf4;
    iVar3 = 0;
    pcStackY_340 = (code *)0x185bef;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100,0);
    auStackY_330._0_8_ = SEXT48(iVar2);
    pvStackY_338 = (void *)0x0;
    if ((void *)auStackY_330._0_8_ != (void *)0x0) goto LAB_00185d01;
    pcStackY_340 = (code *)0x185c17;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_340 = (code *)0x185c2a;
    uv_close((uv_handle_t *)&timer,close_cb);
    pcStackY_340 = (code *)0x185c37;
    uv_run(puVar4,UV_RUN_ONCE);
    auStackY_330._0_8_ = (void *)0x2;
    pvStackY_338 = (void *)(long)close_cb_called;
    if (pvStackY_338 != (void *)0x2) goto LAB_00185d0e;
    auStackY_330._0_8_ = (void *)0x3;
    pvStackY_338 = (void *)(long)fs_event_cb_called;
    if (pvStackY_338 != (void *)0x3) goto LAB_00185d1b;
    pcStackY_340 = (code *)0x185c84;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStackY_340 = (code *)0x185c90;
    remove("watch_dir/");
    pcStackY_340 = (code *)0x185ca1;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStackY_340 = (code *)0x185cab;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_330._0_8_ = (void *)0x0;
    pcStackY_340 = (code *)0x185cbc;
    iVar2 = uv_loop_close(puVar4);
    pvStackY_338 = (void *)(long)iVar2;
    if ((void *)auStackY_330._0_8_ == pvStackY_338) {
      pcStackY_340 = (code *)0x185cd2;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStackY_340 = (code *)0x185ce7;
    run_test_fs_event_close_in_callback_cold_1();
LAB_00185ce7:
    pcStackY_340 = (code *)0x185cf4;
    run_test_fs_event_close_in_callback_cold_2();
LAB_00185cf4:
    pcStackY_340 = (code *)0x185d01;
    run_test_fs_event_close_in_callback_cold_3();
LAB_00185d01:
    pcStackY_340 = (code *)0x185d0e;
    run_test_fs_event_close_in_callback_cold_4();
LAB_00185d0e:
    pcStackY_340 = (code *)0x185d1b;
    run_test_fs_event_close_in_callback_cold_5();
LAB_00185d1b:
    pcStackY_340 = (code *)0x185d28;
    run_test_fs_event_close_in_callback_cold_6();
  }
  puVar7 = (uv_handle_t *)auStackY_330;
  pcStackY_340 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  pcStackY_340 = (code *)(long)iVar3;
  uStackY_348 = 0;
  if (pcStackY_340 == (code *)0x0) {
    pcStackY_340 = (code *)(long)fs_event_cb_called;
    uStackY_348 = 3;
    iVar3 = fs_event_cb_called;
    if ((long)pcStackY_340 < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close(puVar7,close_cb);
        return;
      }
      return;
    }
  }
  else {
    pcStackY_358 = (code *)0x185da8;
    fs_event_cb_close_cold_1();
  }
  pcStackY_358 = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  pcStackY_358 = (code *)0x1f9b0e;
  puStackY_360 = puVar4;
  puVar4 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(puVar4,&uStackY_3c8);
  uStackY_430.data = (void *)(long)iVar2;
  auStackY_440._0_8_ = (uv_loop_t *)0x0;
  if (uStackY_430.data == (void *)0x0) {
    iVar3 = 0;
    iVar2 = uv_fs_event_start(&uStackY_3c8,fs_event_cb_dir,"watch_dir",0);
    uStackY_430.data = (void *)(long)iVar2;
    auStackY_440._0_8_ = (uv_loop_t *)0x0;
    if (uStackY_430.data != (void *)0x0) goto LAB_00185f68;
    iVar2 = uv_fs_event_init(puVar4,&uStackY_430);
    auStackY_440._0_8_ = SEXT48(iVar2);
    auStackY_440._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_440._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f77;
    iVar3 = 0;
    iVar2 = uv_fs_event_start(&uStackY_430,fs_event_cb_dir,"watch_dir",0);
    auStackY_440._0_8_ = SEXT48(iVar2);
    auStackY_440._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_440._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f86;
    uv_close((uv_handle_t *)&uStackY_430,close_cb);
    uv_close((uv_handle_t *)&uStackY_3c8,close_cb);
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_440._0_8_ = (uv_loop_t *)0x2;
    auStackY_440._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStackY_440._8_8_ != (uv_loop_t *)0x2) goto LAB_00185f95;
    remove("watch_dir/");
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_440._0_8_ = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(puVar4);
    auStackY_440._8_8_ = SEXT48(iVar2);
    if (auStackY_440._0_8_ == auStackY_440._8_8_) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00185f68:
    run_test_fs_event_start_and_close_cold_2();
LAB_00185f77:
    run_test_fs_event_start_and_close_cold_3();
LAB_00185f86:
    run_test_fs_event_start_and_close_cold_4();
LAB_00185f95:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar8 = (uv_fs_event_t *)auStackY_440;
  pcVar6 = auStackY_440 + 8;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar8 == &fs_event) {
    if (iVar3 != 0) goto LAB_00186081;
    if (extraout_EDX != 2) goto LAB_00186090;
    iVar3 = strcmp(pcVar6,"file1");
    if (iVar3 != 0) goto LAB_0018609f;
    iVar3 = uv_fs_event_stop(&fs_event);
    if (iVar3 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00186081:
    fs_event_cb_dir_cold_2();
LAB_00186090:
    fs_event_cb_dir_cold_3();
LAB_0018609f:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStackY_8c0 = (uv_loop_t *)0x1860d3;
  puStackY_490 = puVar4;
  puVar4 = uv_default_loop();
  puStackY_8c0 = (uv_loop_t *)0x1860e2;
  create_dir("watch_dir");
  puStackY_8c0 = (uv_loop_t *)0x1860ee;
  create_dir("watch_dir/subfolder");
  lVar5 = 0;
  sVar1 = sStackY_8b0;
  do {
    sStackY_8b0 = sVar1;
    puStackY_8c0 = (uv_loop_t *)0x18610c;
    iVar3 = uv_fs_event_init(puVar4,&fs_event);
    sStackY_8a8 = (size_t)iVar3;
    sStackY_8b0 = 0;
    if (sStackY_8a8 != 0) {
LAB_001863fc:
      puStackY_8c0 = (uv_loop_t *)0x18640b;
      run_test_fs_event_getpath_cold_1();
      goto LAB_0018640b;
    }
    sStackY_8a0 = 0x400;
    puStackY_8c0 = (uv_loop_t *)0x186143;
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_898,&sStackY_8a0);
    sStackY_8a8 = (size_t)iVar3;
    sStackY_8b0 = 0xffffffffffffffea;
    if (sStackY_8a8 != 0xffffffffffffffea) {
LAB_001863ed:
      puStackY_8c0 = (uv_loop_t *)0x1863fc;
      run_test_fs_event_getpath_cold_2();
      goto LAB_001863fc;
    }
    pcVar6 = *(char **)((long)&DAT_00268bc0 + lVar5);
    puStackY_8c0 = (uv_loop_t *)0x186183;
    iVar3 = uv_fs_event_start(&fs_event,fail_cb,pcVar6,0);
    sStackY_8a8 = (size_t)iVar3;
    sStackY_8b0 = 0;
    if (sStackY_8a8 != 0) {
LAB_001863de:
      puStackY_8c0 = (uv_loop_t *)0x1863ed;
      run_test_fs_event_getpath_cold_3();
      goto LAB_001863ed;
    }
    sStackY_8a0 = 0;
    puStackY_8c0 = (uv_loop_t *)0x1861ba;
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_898,&sStackY_8a0);
    sStackY_8a8 = (size_t)iVar3;
    sStackY_8b0 = 0xffffffffffffff97;
    if (sStackY_8a8 != 0xffffffffffffff97) {
LAB_001863cf:
      puStackY_8c0 = (uv_loop_t *)0x1863de;
      run_test_fs_event_getpath_cold_4();
      goto LAB_001863de;
    }
    sStackY_8a8 = sStackY_8a0;
    sStackY_8b0 = 0x400;
    if (0x3ff < (long)sStackY_8a0) {
LAB_001863c0:
      puStackY_8c0 = (uv_loop_t *)0x1863cf;
      run_test_fs_event_getpath_cold_5();
      goto LAB_001863cf;
    }
    puStackY_8c0 = (uv_loop_t *)0x18620a;
    sStackY_8b0 = strlen(pcVar6);
    sStackY_8b0 = sStackY_8b0 + 1;
    if (sStackY_8a8 != sStackY_8b0) {
LAB_001863b1:
      puStackY_8c0 = (uv_loop_t *)0x1863c0;
      run_test_fs_event_getpath_cold_6();
      goto LAB_001863c0;
    }
    puStackY_8c0 = (uv_loop_t *)0x186230;
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_898,&sStackY_8a0);
    sStackY_8a8 = (size_t)iVar3;
    sStackY_8b0 = 0;
    if (sStackY_8a8 != 0) {
LAB_001863a2:
      puStackY_8c0 = (uv_loop_t *)0x1863b1;
      run_test_fs_event_getpath_cold_7();
      goto LAB_001863b1;
    }
    sStackY_8a8 = sStackY_8a0;
    puStackY_8c0 = (uv_loop_t *)0x186262;
    sStackY_8b0 = strlen(pcVar6);
    if (sStackY_8a8 != sStackY_8b0) {
LAB_00186393:
      puStackY_8c0 = (uv_loop_t *)0x1863a2;
      run_test_fs_event_getpath_cold_8();
      goto LAB_001863a2;
    }
    puStackY_8c0 = (uv_loop_t *)0x186282;
    iVar3 = strcmp(acStackY_898,pcVar6);
    if (iVar3 != 0) {
LAB_0018638e:
      puStackY_8c0 = (uv_loop_t *)0x186393;
      run_test_fs_event_getpath_cold_9();
      goto LAB_00186393;
    }
    puStackY_8c0 = (uv_loop_t *)0x186292;
    iVar3 = uv_fs_event_stop(&fs_event);
    sStackY_8a8 = (size_t)iVar3;
    sStackY_8b0 = 0;
    if (sStackY_8a8 != 0) {
LAB_0018637f:
      puStackY_8c0 = (uv_loop_t *)0x18638e;
      run_test_fs_event_getpath_cold_10();
      goto LAB_0018638e;
    }
    puStackY_8c0 = (uv_loop_t *)0x1862c1;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStackY_8c0 = (uv_loop_t *)0x1862cb;
    uv_run(puVar4,UV_RUN_DEFAULT);
    sStackY_8a8 = 1;
    sStackY_8b0 = (size_t)close_cb_called;
    if (sStackY_8b0 != 1) {
      puStackY_8c0 = (uv_loop_t *)0x18637f;
      run_test_fs_event_getpath_cold_11();
      goto LAB_0018637f;
    }
    close_cb_called = 0;
    lVar5 = lVar5 + 8;
    sVar1 = 1;
  } while (lVar5 != 0x28);
  puStackY_8c0 = (uv_loop_t *)0x186314;
  remove("watch_dir/");
  puStackY_8c0 = (uv_loop_t *)0x186325;
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  puStackY_8c0 = (uv_loop_t *)0x18632f;
  uv_run(puVar4,UV_RUN_DEFAULT);
  sStackY_8a8 = 0;
  puStackY_8c0 = (uv_loop_t *)0x186340;
  iVar3 = uv_loop_close(puVar4);
  sStackY_8b0 = (size_t)iVar3;
  if (sStackY_8a8 == sStackY_8b0) {
    puStackY_8c0 = (uv_loop_t *)0x18635c;
    uv_library_shutdown();
    return;
  }
LAB_0018640b:
  puStackY_8c0 = (uv_loop_t *)run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  puStackY_8d8 = (uv_loop_t *)0x186424;
  puStackY_8c0 = puVar4;
  puVar4 = uv_default_loop();
  puStackY_8d8 = (uv_loop_t *)0x186438;
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  puStackY_8d8 = (uv_loop_t *)0x186442;
  uv_run(puVar4,UV_RUN_DEFAULT);
  lStackY_8c8 = 0;
  puStackY_8d8 = (uv_loop_t *)0x186450;
  loop = uv_default_loop();
  puStackY_8d8 = (uv_loop_t *)0x186458;
  iVar3 = uv_loop_close(loop);
  lStackY_8d0 = (long)iVar3;
  if (lStackY_8c8 == lStackY_8d0) {
    puStackY_8d8 = (uv_loop_t *)0x18646e;
    uv_library_shutdown();
    return;
  }
  puStackY_8d8 = (uv_loop_t *)run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStackY_8f0 = (uv_fs_event_t *)0x18648d;
  puStackY_8d8 = puVar4;
  puVar4 = uv_default_loop();
  puStackY_8f0 = (uv_fs_event_t *)0x18649f;
  iVar3 = uv_fs_event_init(puVar4,&fs_event);
  lStackY_8e0 = (long)iVar3;
  lStackY_8e8 = 0;
  if (lStackY_8e0 == 0) {
    puStackY_8f0 = (uv_fs_event_t *)0x1864d9;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar3 == 0) goto LAB_001865ac;
    puStackY_8f0 = (uv_fs_event_t *)0x1864ed;
    iVar3 = uv_is_active((uv_handle_t *)&fs_event);
    lStackY_8e0 = (long)iVar3;
    lStackY_8e8 = 0;
    if (lStackY_8e0 != 0) goto LAB_001865b1;
    puStackY_8f0 = (uv_fs_event_t *)0x186527;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar3 == 0) goto LAB_001865be;
    puStackY_8f0 = (uv_fs_event_t *)0x18653b;
    iVar3 = uv_is_active((uv_handle_t *)&fs_event);
    lStackY_8e0 = (long)iVar3;
    lStackY_8e8 = 0;
    if (lStackY_8e0 != 0) goto LAB_001865c3;
    puStackY_8f0 = (uv_fs_event_t *)0x186566;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStackY_8f0 = (uv_fs_event_t *)0x186570;
    uv_run(puVar4,UV_RUN_DEFAULT);
    lStackY_8e0 = 0;
    puStackY_8f0 = (uv_fs_event_t *)0x186581;
    iVar3 = uv_loop_close(puVar4);
    lStackY_8e8 = (long)iVar3;
    if (lStackY_8e0 == lStackY_8e8) {
      puStackY_8f0 = (uv_fs_event_t *)0x186597;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStackY_8f0 = (uv_fs_event_t *)0x1865ac;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_001865ac:
    puStackY_8f0 = (uv_fs_event_t *)0x1865b1;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_001865b1:
    puStackY_8f0 = (uv_fs_event_t *)0x1865be;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_001865be:
    puStackY_8f0 = (uv_fs_event_t *)0x1865c3;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_001865c3:
    puStackY_8f0 = (uv_fs_event_t *)0x1865d0;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStackY_8f0 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStackY_8f0 = &fs_event;
  puVar8 = (uv_fs_event_t *)auStackY_a00;
  uStackY_9f0.next = (uv__queue *)0x746e6576655f7366;
  uStackY_9f0.prev = (uv__queue *)0x6e695f706f74735f;
  puStackY_9e0 = (uv__queue *)0x7478742e62635f;
  puStackY_8f8 = puVar4;
  remove((char *)&uStackY_9f0);
  create_file((char *)&uStackY_9f0);
  puVar4 = uv_default_loop();
  iVar3 = uv_fs_event_init(puVar4,&uStackY_960);
  uStackY_9d8.data = (void *)(long)iVar3;
  auStackY_a00._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)uStackY_9d8.data == (uv__queue *)0x0) {
    iVar3 = uv_fs_event_start(&uStackY_960,fs_event_cb_stop,(char *)&uStackY_9f0,0);
    uStackY_9d8.data = (void *)(long)iVar3;
    auStackY_a00._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStackY_9d8.data != (uv__queue *)0x0) goto LAB_0018687e;
    uStackY_9d8.data = &uStackY_9f0;
    puVar4 = uv_default_loop();
    iVar3 = uv_timer_init(puVar4,&uStackY_9d8);
    auStackY_a00._0_8_ = SEXT48(iVar3);
    auStackY_a00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_a00._0_8_ != (uv_loop_t *)0x0) goto LAB_0018688b;
    iVar3 = uv_timer_start(&uStackY_9d8,timer_cb_touch,100,0);
    auStackY_a00._0_8_ = SEXT48(iVar3);
    auStackY_a00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_a00._0_8_ != (uv_loop_t *)0x0) goto LAB_00186898;
    auStackY_a00._0_8_ = SEXT48(fs_event_cb_stop_calls);
    auStackY_a00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_a00._0_8_ != (uv_loop_t *)0x0) goto LAB_001868a5;
    auStackY_a00._0_8_ = SEXT48(timer_cb_touch_called);
    auStackY_a00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_a00._0_8_ != (uv_loop_t *)0x0) goto LAB_001868b2;
    puVar4 = uv_default_loop();
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_a00._0_8_ = SEXT48(iVar3);
    auStackY_a00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_a00._0_8_ != (uv_loop_t *)0x0) goto LAB_001868bf;
    auStackY_a00._0_8_ = (uv_loop_t *)0x1;
    auStackY_a00._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStackY_a00._8_8_ != (uv_loop_t *)0x1) goto LAB_001868cc;
    auStackY_a00._0_8_ = (uv_loop_t *)0x1;
    auStackY_a00._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)auStackY_a00._8_8_ != (uv_loop_t *)0x1) goto LAB_001868d9;
    uv_close((uv_handle_t *)&uStackY_960,(uv_close_cb)0x0);
    puVar4 = uv_default_loop();
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_a00._0_8_ = SEXT48(iVar3);
    auStackY_a00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_a00._0_8_ != (uv_loop_t *)0x0) goto LAB_001868e6;
    auStackY_a00._0_8_ = (uv_loop_t *)0x1;
    auStackY_a00._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStackY_a00._8_8_ == (uv_loop_t *)0x1) {
      remove((char *)&uStackY_9f0);
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      auStackY_a00._0_8_ = (uv_loop_t *)0x0;
      puVar4 = uv_default_loop();
      iVar3 = uv_loop_close(puVar4);
      auStackY_a00._8_8_ = SEXT48(iVar3);
      if (auStackY_a00._0_8_ == auStackY_a00._8_8_) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00186900;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018687e:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018688b:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_00186898:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_001868a5:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_001868b2:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_001868bf:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_001868cc:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_001868d9:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_001868e6:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_00186900:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop(puVar8);
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return;
}

Assistant:

static void touch_file(const char* name) {
  int r;
  uv_os_fd_t file;
  uv_fs_t req;
  uv_buf_t buf;

  r = uv_fs_open(NULL, &req, name, UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  buf = uv_buf_init("foo", 4);
  r = uv_fs_write(NULL, &req, file, &buf, 1, -1, NULL);
  ASSERT_GE(r, 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
}